

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComponent.cpp
# Opt level: O3

void __thiscall
RemoveVCProcessTest_testTextureRemove_Test::TestBody
          (RemoveVCProcessTest_testTextureRemove_Test *this)

{
  char *pcVar1;
  char *in_R9;
  bool bVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  Message local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  string local_30;
  
  ((this->super_RemoveVCProcessTest).piProcess)->configDeleteFlags = 0x80;
  (*(((this->super_RemoveVCProcessTest).piProcess)->super_BaseProcess)._vptr_BaseProcess[5])();
  bVar2 = ((this->super_RemoveVCProcessTest).pScene)->mTextures == (aiTexture **)0x0;
  local_48.ss_.ptr_._0_4_ = CONCAT31(local_48.ss_.ptr_._1_3_,bVar2);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_48,(AssertionResult *)"NULL == pScene->mTextures",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0xa1,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                      (char)local_30._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p));
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_30,"0U","pScene->mNumTextures",(uint *)&local_48,
             &((this->super_RemoveVCProcessTest).pScene)->mNumTextures);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_48);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0xa2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_30,"0U","pScene->mFlags",(uint *)&local_48,
             &((this->super_RemoveVCProcessTest).pScene)->mFlags);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_48);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0xa3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(RemoveVCProcessTest, testTextureRemove)
{
    piProcess->SetDeleteFlags(aiComponent_TEXTURES);
    piProcess->Execute(pScene);

    EXPECT_TRUE(NULL == pScene->mTextures);
    EXPECT_EQ(0U, pScene->mNumTextures);
    EXPECT_EQ(0U, pScene->mFlags);
}